

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  type_conflict5 tVar5;
  bool bVar6;
  VarStatus VVar7;
  double *pdVar8;
  SPxInternalCodeException *pSVar9;
  pointer pnVar10;
  cpp_dec_float<100U,_int,_void> *pcVar11;
  long lVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  long lVar14;
  ulong uVar15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  cpp_dec_float<100U,_int,_void> local_1758;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1708;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_25;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1668;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_23;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_15c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_21;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1528;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_19;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1488;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13e8;
  cpp_dec_float<100U,_int,_void> local_1398;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1348;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1208;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1168;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1028;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fd8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f38;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  int local_ea8;
  undefined1 local_ea4;
  undefined8 local_ea0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e98;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  int local_e08;
  undefined1 local_e04;
  undefined8 local_e00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_df8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_da8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d08;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_cb8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ad8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_990;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_940;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_850;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_800;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_760;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_710;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c0;
  cpp_dec_float<100U,_int,_void> local_670;
  cpp_dec_float<100U,_int,_void> local_620;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_580;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  cpp_dec_float<100U,_int,_void> local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_490;
  cpp_dec_float<100U,_int,_void> local_440;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_300;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  cpp_dec_float<100U,_int,_void> local_260;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  cpp_dec_float<100U,_int,_void> local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_170;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    uVar15 = (ulong)(uint)(this->m_perm).thesize;
    lVar12 = uVar15 * 0x50;
    for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
      lVar14 = (long)(this->m_perm).data[uVar15 - 1];
      if (-1 < lVar14) {
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   ((long)pnVar10[-1].m_backend.data._M_elems + lVar12),&pnVar10[lVar14].m_backend);
        pnVar10 = (r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   ((long)pnVar10[-1].m_backend.data._M_elems + lVar12),&pnVar10[lVar14].m_backend);
        cStatus->data[uVar15 - 1] = cStatus->data[lVar14];
      }
      lVar12 = lVar12 + -0x50;
    }
    return;
  }
  iVar3 = this->m_k;
  switch(cStatus->data[iVar3]) {
  case ON_UPPER:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&(this->m_upK).m_backend)
    ;
    scale1.m_backend.data._M_elems._0_8_ = (ulong)scale1.m_backend.data._M_elems[1] << 0x20;
    tVar5 = boost::multiprecision::operator>(&this->m_scale,(int *)&scale1);
    pcVar13 = &(x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    if (!tVar5) goto LAB_0034cf95;
LAB_0034d67b:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (pcVar13,&(this->m_upJ).m_backend);
    bVar6 = boost::multiprecision::operator==(&this->m_loJ,&this->m_upJ);
    VVar7 = (uint)bVar6 * 2;
    break;
  case ON_LOWER:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&(this->m_loK).m_backend)
    ;
    scale1.m_backend.data._M_elems._0_8_ = (ulong)scale1.m_backend.data._M_elems[1] << 0x20;
    tVar5 = boost::multiprecision::operator>(&this->m_scale,(int *)&scale1);
    pcVar13 = &(x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    if (!tVar5) goto LAB_0034d67b;
LAB_0034cf95:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (pcVar13,&(this->m_loJ).m_backend);
    bVar6 = boost::multiprecision::operator==(&this->m_loJ,&this->m_upJ);
    VVar7 = bVar6 + ON_LOWER;
    break;
  case FIXED:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
               &(this->m_loJ).m_backend);
LAB_0034d502:
    cStatus->data[this->m_j] = FIXED;
    goto switchD_0034cf56_default;
  case ZERO:
    pnVar4 = &this->m_loK;
    local_a88.m_backend.data._M_elems[0] = (this->m_loK).m_backend.data._M_elems[0];
    local_a88.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
    local_a88.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
    local_a88.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
    local_a88.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
    local_a88.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
    local_a88.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
    local_a88.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
    local_a88.m_backend.data._M_elems[8] = (this->m_loK).m_backend.data._M_elems[8];
    local_a88.m_backend.data._M_elems[9] = (this->m_loK).m_backend.data._M_elems[9];
    local_a88.m_backend.data._M_elems[10] = (this->m_loK).m_backend.data._M_elems[10];
    local_a88.m_backend.data._M_elems[0xb] = (this->m_loK).m_backend.data._M_elems[0xb];
    local_a88.m_backend.data._M_elems[0xc] = (this->m_loK).m_backend.data._M_elems[0xc];
    local_a88.m_backend.data._M_elems[0xd] = (this->m_loK).m_backend.data._M_elems[0xd];
    local_a88.m_backend.data._M_elems[0xe] = (this->m_loK).m_backend.data._M_elems[0xe];
    local_a88.m_backend.data._M_elems[0xf] = (this->m_loK).m_backend.data._M_elems[0xf];
    local_a88.m_backend.exp = (this->m_loK).m_backend.exp;
    local_a88.m_backend.neg = (this->m_loK).m_backend.neg;
    local_a88.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_a88.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_80,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_a88,&local_80);
    if (bVar6) {
      local_ad8.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
      local_ad8.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
      local_ad8.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
      local_ad8.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
      local_ad8.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
      local_ad8.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
      local_ad8.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
      local_ad8.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
      local_ad8.m_backend.data._M_elems[8] = (this->m_upK).m_backend.data._M_elems[8];
      local_ad8.m_backend.data._M_elems[9] = (this->m_upK).m_backend.data._M_elems[9];
      local_ad8.m_backend.data._M_elems[10] = (this->m_upK).m_backend.data._M_elems[10];
      local_ad8.m_backend.data._M_elems[0xb] = (this->m_upK).m_backend.data._M_elems[0xb];
      local_ad8.m_backend.data._M_elems[0xc] = (this->m_upK).m_backend.data._M_elems[0xc];
      local_ad8.m_backend.data._M_elems[0xd] = (this->m_upK).m_backend.data._M_elems[0xd];
      local_ad8.m_backend.data._M_elems[0xe] = (this->m_upK).m_backend.data._M_elems[0xe];
      local_ad8.m_backend.data._M_elems[0xf] = (this->m_upK).m_backend.data._M_elems[0xf];
      local_ad8.m_backend.exp = (this->m_upK).m_backend.exp;
      local_ad8.m_backend.neg = (this->m_upK).m_backend.neg;
      local_ad8.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
      local_ad8.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_d0,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_ad8,&local_d0);
      if ((!bVar6) || (bVar6 = boost::multiprecision::operator==(pnVar4,&this->m_upK), !bVar6))
      goto LAB_0034d8f0;
      VVar7 = FIXED;
    }
    else {
LAB_0034d8f0:
      local_b28.m_backend.data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      local_b28.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
      local_b28.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
      local_b28.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
      local_b28.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
      local_b28.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
      local_b28.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
      local_b28.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
      local_b28.m_backend.data._M_elems[8] = (this->m_loK).m_backend.data._M_elems[8];
      local_b28.m_backend.data._M_elems[9] = (this->m_loK).m_backend.data._M_elems[9];
      local_b28.m_backend.data._M_elems[10] = (this->m_loK).m_backend.data._M_elems[10];
      local_b28.m_backend.data._M_elems[0xb] = (this->m_loK).m_backend.data._M_elems[0xb];
      local_b28.m_backend.data._M_elems[0xc] = (this->m_loK).m_backend.data._M_elems[0xc];
      local_b28.m_backend.data._M_elems[0xd] = (this->m_loK).m_backend.data._M_elems[0xd];
      local_b28.m_backend.data._M_elems[0xe] = (this->m_loK).m_backend.data._M_elems[0xe];
      local_b28.m_backend.data._M_elems[0xf] = (this->m_loK).m_backend.data._M_elems[0xf];
      local_b28.m_backend.exp = (this->m_loK).m_backend.exp;
      local_b28.m_backend.neg = (this->m_loK).m_backend.neg;
      local_b28.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
      local_b28.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_120,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_b28,&local_120);
      if (bVar6) {
        VVar7 = ON_LOWER;
      }
      else {
        local_b78.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
        local_b78.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
        local_b78.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
        local_b78.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
        local_b78.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
        local_b78.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
        local_b78.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
        local_b78.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
        local_b78.m_backend.data._M_elems[8] = (this->m_upK).m_backend.data._M_elems[8];
        local_b78.m_backend.data._M_elems[9] = (this->m_upK).m_backend.data._M_elems[9];
        local_b78.m_backend.data._M_elems[10] = (this->m_upK).m_backend.data._M_elems[10];
        local_b78.m_backend.data._M_elems[0xb] = (this->m_upK).m_backend.data._M_elems[0xb];
        local_b78.m_backend.data._M_elems[0xc] = (this->m_upK).m_backend.data._M_elems[0xc];
        local_b78.m_backend.data._M_elems[0xd] = (this->m_upK).m_backend.data._M_elems[0xd];
        local_b78.m_backend.data._M_elems[0xe] = (this->m_upK).m_backend.data._M_elems[0xe];
        local_b78.m_backend.data._M_elems[0xf] = (this->m_upK).m_backend.data._M_elems[0xf];
        local_b78.m_backend.exp = (this->m_upK).m_backend.exp;
        local_b78.m_backend.neg = (this->m_upK).m_backend.neg;
        local_b78.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
        local_b78.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_170,this);
        bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_b78,&local_170);
        VVar7 = ON_UPPER;
        if (!bVar6) {
          local_bc8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems
          ;
          local_bc8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
          local_bc8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
          local_bc8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
          local_bc8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
          local_bc8.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 10);
          local_bc8.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xc);
          local_bc8.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xe);
          local_bc8.m_backend.exp = (this->m_loK).m_backend.exp;
          local_bc8.m_backend.neg = (this->m_loK).m_backend.neg;
          local_bc8.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
          local_bc8.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_1c0,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_210,this);
          bVar6 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_bc8,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1c0,&local_210);
          if (!bVar6) {
LAB_0034ec52:
            pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&scale1,"XMAISM05 This should never happen.",(allocator *)&scale2);
            SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&scale1);
            __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          local_c18.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
          local_c18.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
          local_c18.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
          local_c18.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
          local_c18.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
          local_c18.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 10);
          local_c18.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xc);
          local_c18.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xe);
          local_c18.m_backend.exp = (this->m_upK).m_backend.exp;
          local_c18.m_backend.neg = (this->m_upK).m_backend.neg;
          local_c18.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          local_c18.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_260,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_2b0,this);
          bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_c18,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_260,&local_2b0);
          if (!bVar6) goto LAB_0034ec52;
          VVar7 = ZERO;
        }
      }
    }
    cStatus->data[this->m_k] = VVar7;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)
               ((x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
    pnVar4 = &this->m_loJ;
    local_c68.m_backend.data._M_elems[0] = (this->m_loJ).m_backend.data._M_elems[0];
    local_c68.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_c68.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_c68.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_c68.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_c68.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_c68.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_c68.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_c68.m_backend.data._M_elems[8] = (this->m_loJ).m_backend.data._M_elems[8];
    local_c68.m_backend.data._M_elems[9] = (this->m_loJ).m_backend.data._M_elems[9];
    local_c68.m_backend.data._M_elems[10] = (this->m_loJ).m_backend.data._M_elems[10];
    local_c68.m_backend.data._M_elems[0xb] = (this->m_loJ).m_backend.data._M_elems[0xb];
    local_c68.m_backend.data._M_elems[0xc] = (this->m_loJ).m_backend.data._M_elems[0xc];
    local_c68.m_backend.data._M_elems[0xd] = (this->m_loJ).m_backend.data._M_elems[0xd];
    local_c68.m_backend.data._M_elems[0xe] = (this->m_loJ).m_backend.data._M_elems[0xe];
    local_c68.m_backend.data._M_elems[0xf] = (this->m_loJ).m_backend.data._M_elems[0xf];
    local_c68.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_c68.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_c68.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_c68.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_300,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_c68,&local_300);
    if (bVar6) {
      local_cb8.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_cb8.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_cb8.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_cb8.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_cb8.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_cb8.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_cb8.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_cb8.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_cb8.m_backend.data._M_elems[8] = (this->m_upJ).m_backend.data._M_elems[8];
      local_cb8.m_backend.data._M_elems[9] = (this->m_upJ).m_backend.data._M_elems[9];
      local_cb8.m_backend.data._M_elems[10] = (this->m_upJ).m_backend.data._M_elems[10];
      local_cb8.m_backend.data._M_elems[0xb] = (this->m_upJ).m_backend.data._M_elems[0xb];
      local_cb8.m_backend.data._M_elems[0xc] = (this->m_upJ).m_backend.data._M_elems[0xc];
      local_cb8.m_backend.data._M_elems[0xd] = (this->m_upJ).m_backend.data._M_elems[0xd];
      local_cb8.m_backend.data._M_elems[0xe] = (this->m_upJ).m_backend.data._M_elems[0xe];
      local_cb8.m_backend.data._M_elems[0xf] = (this->m_upJ).m_backend.data._M_elems[0xf];
      local_cb8.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_cb8.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_cb8.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_cb8.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_350,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_cb8,&local_350);
      if ((bVar6) && (bVar6 = boost::multiprecision::operator==(pnVar4,&this->m_upJ), bVar6))
      goto LAB_0034d502;
    }
    local_d08.m_backend.data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    local_d08.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_d08.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_d08.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_d08.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_d08.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_d08.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_d08.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_d08.m_backend.data._M_elems[8] = (this->m_loJ).m_backend.data._M_elems[8];
    local_d08.m_backend.data._M_elems[9] = (this->m_loJ).m_backend.data._M_elems[9];
    local_d08.m_backend.data._M_elems[10] = (this->m_loJ).m_backend.data._M_elems[10];
    local_d08.m_backend.data._M_elems[0xb] = (this->m_loJ).m_backend.data._M_elems[0xb];
    local_d08.m_backend.data._M_elems[0xc] = (this->m_loJ).m_backend.data._M_elems[0xc];
    local_d08.m_backend.data._M_elems[0xd] = (this->m_loJ).m_backend.data._M_elems[0xd];
    local_d08.m_backend.data._M_elems[0xe] = (this->m_loJ).m_backend.data._M_elems[0xe];
    local_d08.m_backend.data._M_elems[0xf] = (this->m_loJ).m_backend.data._M_elems[0xf];
    local_d08.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_d08.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_d08.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_d08.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_3a0,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_d08,&local_3a0);
    if (bVar6) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      local_d58.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_d58.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_d58.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_d58.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_d58.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_d58.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_d58.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_d58.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_d58.m_backend.data._M_elems[8] = (this->m_upJ).m_backend.data._M_elems[8];
      local_d58.m_backend.data._M_elems[9] = (this->m_upJ).m_backend.data._M_elems[9];
      local_d58.m_backend.data._M_elems[10] = (this->m_upJ).m_backend.data._M_elems[10];
      local_d58.m_backend.data._M_elems[0xb] = (this->m_upJ).m_backend.data._M_elems[0xb];
      local_d58.m_backend.data._M_elems[0xc] = (this->m_upJ).m_backend.data._M_elems[0xc];
      local_d58.m_backend.data._M_elems[0xd] = (this->m_upJ).m_backend.data._M_elems[0xd];
      local_d58.m_backend.data._M_elems[0xe] = (this->m_upJ).m_backend.data._M_elems[0xe];
      local_d58.m_backend.data._M_elems[0xf] = (this->m_upJ).m_backend.data._M_elems[0xf];
      local_d58.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_d58.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_d58.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_d58.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_3f0,this);
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_d58,&local_3f0);
      if (!bVar6) {
        local_da8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
        local_da8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
        local_da8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
        local_da8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
        local_da8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
        local_da8.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 10);
        local_da8.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xc);
        local_da8.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 0xe);
        local_da8.m_backend.exp = (this->m_loJ).m_backend.exp;
        local_da8.m_backend.neg = (this->m_loJ).m_backend.neg;
        local_da8.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
        local_da8.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_440,0.0,(type *)0x0);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_490,this);
        bVar6 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_da8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_440,&local_490);
        if (bVar6) {
          local_df8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
          local_df8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
          local_df8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
          local_df8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
          local_df8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
          local_df8.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 10);
          local_df8.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xc);
          local_df8.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 0xe);
          local_df8.m_backend.exp = (this->m_upJ).m_backend.exp;
          local_df8.m_backend.neg = (this->m_upJ).m_backend.neg;
          local_df8.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
          local_df8.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_4e0,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_530,this);
          bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_df8,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_4e0,&local_530);
          if (bVar6) {
            cStatus->data[this->m_j] = ZERO;
            goto switchD_0034cf56_default;
          }
        }
        pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&scale1,"XMAISM06 This should never happen.",(allocator *)&scale2);
        SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&scale1);
        __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      cStatus->data[this->m_j] = ON_UPPER;
    }
    goto switchD_0034cf56_default;
  case BASIC:
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_e48 = *(undefined8 *)pnVar4[iVar3].m_backend.data._M_elems;
    uStack_e40 = *(undefined8 *)(pnVar4[iVar3].m_backend.data._M_elems + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 4;
    local_e38 = *(undefined8 *)puVar2;
    uStack_e30 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 8;
    local_e28 = *(undefined8 *)puVar2;
    uStack_e20 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 0xc;
    local_e18 = *(undefined8 *)puVar2;
    uStack_e10 = *(undefined8 *)(puVar2 + 2);
    local_e08 = pnVar4[iVar3].m_backend.exp;
    local_e04 = pnVar4[iVar3].m_backend.neg;
    local_e00._0_4_ = pnVar4[iVar3].m_backend.fpclass;
    local_e00._4_4_ = pnVar4[iVar3].m_backend.prec_elem;
    local_e98.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_loK).m_backend.data._M_elems;
    local_e98.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
    local_e98.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
    local_e98.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
    local_e98.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    local_e98.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 10);
    local_e98.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xc);
    local_e98.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 0xe);
    local_e98.m_backend.exp = (this->m_loK).m_backend.exp;
    local_e98.m_backend.neg = (this->m_loK).m_backend.neg;
    local_e98.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_e98.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&scale1,(soplex *)&local_e48,&local_e98,pnVar4);
    iVar3 = this->m_k;
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_ee8 = *(undefined8 *)pnVar4[iVar3].m_backend.data._M_elems;
    uStack_ee0 = *(undefined8 *)(pnVar4[iVar3].m_backend.data._M_elems + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 4;
    local_ed8 = *(undefined8 *)puVar2;
    uStack_ed0 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 8;
    local_ec8 = *(undefined8 *)puVar2;
    uStack_ec0 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar4[iVar3].m_backend.data._M_elems + 0xc;
    local_eb8 = *(undefined8 *)puVar2;
    uStack_eb0 = *(undefined8 *)(puVar2 + 2);
    local_ea8 = pnVar4[iVar3].m_backend.exp;
    local_ea4 = pnVar4[iVar3].m_backend.neg;
    local_ea0._0_4_ = pnVar4[iVar3].m_backend.fpclass;
    local_ea0._4_4_ = pnVar4[iVar3].m_backend.prec_elem;
    local_f38.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
    local_f38.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
    local_f38.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
    local_f38.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
    local_f38.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
    local_f38.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 10);
    local_f38.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xc);
    local_f38.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 0xe);
    local_f38.m_backend.exp = (this->m_upK).m_backend.exp;
    local_f38.m_backend.neg = (this->m_upK).m_backend.neg;
    local_f38.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
    local_f38.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&scale2,(soplex *)&local_ee8,&local_f38,pnVar4);
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0x3ff00000;
    tVar5 = boost::multiprecision::operator<(&scale1,(double *)&z1);
    if (tVar5) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&scale1,1.0);
    }
    pnVar4 = &this->m_loK;
    u = &this->m_upK;
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0x3ff00000;
    tVar5 = boost::multiprecision::operator<(&scale2,(double *)&z1);
    if (tVar5) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&scale2,1.0);
    }
    z2.m_backend.fpclass = cpp_dec_float_finite;
    z2.m_backend.prec_elem = 0x10;
    z2.m_backend.data._M_elems[0] = 0;
    z2.m_backend.data._M_elems[1] = 0;
    z2.m_backend.data._M_elems[2] = 0;
    z2.m_backend.data._M_elems[3] = 0;
    z2.m_backend.data._M_elems[4] = 0;
    z2.m_backend.data._M_elems[5] = 0;
    z2.m_backend.data._M_elems[6] = 0;
    z2.m_backend.data._M_elems[7] = 0;
    z2.m_backend.data._M_elems[8] = 0;
    z2.m_backend.data._M_elems[9] = 0;
    z2.m_backend.data._M_elems[10] = 0;
    z2.m_backend.data._M_elems[0xb] = 0;
    z2.m_backend.data._M_elems[0xc] = 0;
    z2.m_backend.data._M_elems[0xd] = 0;
    z2.m_backend.data._M_elems[0xe] = 0;
    z2.m_backend.data._M_elems[0xf] = 0;
    z2.m_backend.exp = 0;
    z2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&z2.m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&scale1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems._56_5_ = 0;
    result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_1.m_backend,&pnVar4->m_backend,&scale1.m_backend);
    z1.m_backend.fpclass = cpp_dec_float_finite;
    z1.m_backend.prec_elem = 0x10;
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0;
    z1.m_backend.data._M_elems[2] = 0;
    z1.m_backend.data._M_elems[3] = 0;
    z1.m_backend.data._M_elems[4] = 0;
    z1.m_backend.data._M_elems[5] = 0;
    z1.m_backend.data._M_elems[6] = 0;
    z1.m_backend.data._M_elems[7] = 0;
    z1.m_backend.data._M_elems[8] = 0;
    z1.m_backend.data._M_elems[9] = 0;
    z1.m_backend.data._M_elems[10] = 0;
    z1.m_backend.data._M_elems[0xb] = 0;
    z1.m_backend.data._M_elems[0xc] = 0;
    z1.m_backend.data._M_elems[0xd] = 0;
    z1.m_backend.data._M_elems[0xe] = 0;
    z1.m_backend.data._M_elems[0xf] = 0;
    z1.m_backend.exp = 0;
    z1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&z1.m_backend,&z2.m_backend,&result_1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems._56_5_ = 0;
    result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_1.m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&scale2.m_backend);
    result_4.m_backend.fpclass = cpp_dec_float_finite;
    result_4.m_backend.prec_elem = 0x10;
    result_4.m_backend.data._M_elems[0] = 0;
    result_4.m_backend.data._M_elems[1] = 0;
    result_4.m_backend.data._M_elems[2] = 0;
    result_4.m_backend.data._M_elems[3] = 0;
    result_4.m_backend.data._M_elems[4] = 0;
    result_4.m_backend.data._M_elems[5] = 0;
    result_4.m_backend.data._M_elems[6] = 0;
    result_4.m_backend.data._M_elems[7] = 0;
    result_4.m_backend.data._M_elems[8] = 0;
    result_4.m_backend.data._M_elems[9] = 0;
    result_4.m_backend.data._M_elems[10] = 0;
    result_4.m_backend.data._M_elems[0xb] = 0;
    result_4.m_backend.data._M_elems[0xc] = 0;
    result_4.m_backend.data._M_elems[0xd] = 0;
    result_4.m_backend.data._M_elems._56_5_ = 0;
    result_4.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_4.m_backend.exp = 0;
    result_4.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_4.m_backend,&u->m_backend,&scale2.m_backend);
    z2.m_backend.fpclass = cpp_dec_float_finite;
    z2.m_backend.prec_elem = 0x10;
    z2.m_backend.data._M_elems[0] = 0;
    z2.m_backend.data._M_elems[1] = 0;
    z2.m_backend.data._M_elems[2] = 0;
    z2.m_backend.data._M_elems[3] = 0;
    z2.m_backend.data._M_elems[4] = 0;
    z2.m_backend.data._M_elems[5] = 0;
    z2.m_backend.data._M_elems[6] = 0;
    z2.m_backend.data._M_elems[7] = 0;
    z2.m_backend.data._M_elems[8] = 0;
    z2.m_backend.data._M_elems[9] = 0;
    z2.m_backend.data._M_elems[10] = 0;
    z2.m_backend.data._M_elems[0xb] = 0;
    z2.m_backend.data._M_elems[0xc] = 0;
    z2.m_backend.data._M_elems[0xd] = 0;
    z2.m_backend.data._M_elems[0xe] = 0;
    z2.m_backend.data._M_elems[0xf] = 0;
    z2.m_backend.exp = 0;
    z2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&z2.m_backend,&result_1.m_backend,&result_4.m_backend);
    local_f88.m_backend.data._M_elems[0] = z1.m_backend.data._M_elems[0];
    local_f88.m_backend.data._M_elems[1] = z1.m_backend.data._M_elems[1];
    local_f88.m_backend.data._M_elems[2] = z1.m_backend.data._M_elems[2];
    local_f88.m_backend.data._M_elems[3] = z1.m_backend.data._M_elems[3];
    local_f88.m_backend.data._M_elems[4] = z1.m_backend.data._M_elems[4];
    local_f88.m_backend.data._M_elems[5] = z1.m_backend.data._M_elems[5];
    local_f88.m_backend.data._M_elems[6] = z1.m_backend.data._M_elems[6];
    local_f88.m_backend.data._M_elems[7] = z1.m_backend.data._M_elems[7];
    local_f88.m_backend.data._M_elems[8] = z1.m_backend.data._M_elems[8];
    local_f88.m_backend.data._M_elems[9] = z1.m_backend.data._M_elems[9];
    local_f88.m_backend.data._M_elems[10] = z1.m_backend.data._M_elems[10];
    local_f88.m_backend.data._M_elems[0xb] = z1.m_backend.data._M_elems[0xb];
    local_f88.m_backend.data._M_elems[0xc] = z1.m_backend.data._M_elems[0xc];
    local_f88.m_backend.data._M_elems[0xd] = z1.m_backend.data._M_elems[0xd];
    local_f88.m_backend.data._M_elems[0xe] = z1.m_backend.data._M_elems[0xe];
    local_f88.m_backend.data._M_elems[0xf] = z1.m_backend.data._M_elems[0xf];
    local_f88.m_backend.exp = z1.m_backend.exp;
    local_f88.m_backend.neg = z1.m_backend.neg;
    local_f88.m_backend.fpclass = z1.m_backend.fpclass;
    local_f88.m_backend.prec_elem = z1.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_580,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_f88,&local_580);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&z1,0.0);
    }
    local_fd8.m_backend.data._M_elems[0xc] = z2.m_backend.data._M_elems[0xc];
    local_fd8.m_backend.data._M_elems[0xd] = z2.m_backend.data._M_elems[0xd];
    local_fd8.m_backend.data._M_elems[0xe] = z2.m_backend.data._M_elems[0xe];
    local_fd8.m_backend.data._M_elems[0xf] = z2.m_backend.data._M_elems[0xf];
    local_fd8.m_backend.data._M_elems[8] = z2.m_backend.data._M_elems[8];
    local_fd8.m_backend.data._M_elems[9] = z2.m_backend.data._M_elems[9];
    local_fd8.m_backend.data._M_elems[10] = z2.m_backend.data._M_elems[10];
    local_fd8.m_backend.data._M_elems[0xb] = z2.m_backend.data._M_elems[0xb];
    local_fd8.m_backend.data._M_elems[4] = z2.m_backend.data._M_elems[4];
    local_fd8.m_backend.data._M_elems[5] = z2.m_backend.data._M_elems[5];
    local_fd8.m_backend.data._M_elems[6] = z2.m_backend.data._M_elems[6];
    local_fd8.m_backend.data._M_elems[7] = z2.m_backend.data._M_elems[7];
    local_fd8.m_backend.data._M_elems[0] = z2.m_backend.data._M_elems[0];
    local_fd8.m_backend.data._M_elems[1] = z2.m_backend.data._M_elems[1];
    local_fd8.m_backend.data._M_elems[2] = z2.m_backend.data._M_elems[2];
    local_fd8.m_backend.data._M_elems[3] = z2.m_backend.data._M_elems[3];
    local_fd8.m_backend.exp = z2.m_backend.exp;
    local_fd8.m_backend.neg = z2.m_backend.neg;
    local_fd8.m_backend.fpclass = z2.m_backend.fpclass;
    local_fd8.m_backend.prec_elem = z2.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_5d0,this);
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_fd8,&local_5d0);
    if (bVar6) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&z2,0.0);
    }
    pcVar13 = &(this->m_loJ).m_backend;
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&result_1.m_backend,-*pdVar8,(type *)0x0);
    tVar5 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pcVar13,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_1.m_backend);
    if (tVar5) {
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&result_4.m_backend,*pdVar8,(type *)0x0);
      tVar5 = boost::multiprecision::operator>=
                        (&this->m_upJ,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_4.m_backend);
      if (tVar5) {
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_620,-*pdVar8,(type *)0x0);
        tVar5 = boost::multiprecision::operator<=
                          (pnVar4,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_620);
        if (tVar5) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_670,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator>=
                            (u,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_670);
          if (tVar5) {
            iVar3 = this->m_j;
            cStatus->data[iVar3] = ZERO;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)
                       ((x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar3),0.0);
            goto switchD_0034cf56_default;
          }
        }
      }
    }
    u_00 = &this->m_scale;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    tVar5 = boost::multiprecision::operator>(u_00,(double *)&result_1);
    pnVar10 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k;
    if (tVar5) {
      local_1028.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar10->m_backend).data;
      local_1028.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 2);
      local_1028.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 4);
      local_1028.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 6);
      local_1028.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 8);
      local_1028.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 10);
      local_1028.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 0xc);
      local_1028.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 0xe);
      local_1028.m_backend.exp = (pnVar10->m_backend).exp;
      local_1028.m_backend.neg = (pnVar10->m_backend).neg;
      local_1028.m_backend.fpclass = (pnVar10->m_backend).fpclass;
      local_1028.m_backend.prec_elem = (pnVar10->m_backend).prec_elem;
      pnVar1 = &this->m_upJ;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems._56_5_ = 0;
      result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 0x10;
      result_7.m_backend.data._M_elems[0] = 0;
      result_7.m_backend.data._M_elems[1] = 0;
      result_7.m_backend.data._M_elems[2] = 0;
      result_7.m_backend.data._M_elems[3] = 0;
      result_7.m_backend.data._M_elems[4] = 0;
      result_7.m_backend.data._M_elems[5] = 0;
      result_7.m_backend.data._M_elems[6] = 0;
      result_7.m_backend.data._M_elems[7] = 0;
      result_7.m_backend.data._M_elems[8] = 0;
      result_7.m_backend.data._M_elems[9] = 0;
      result_7.m_backend.data._M_elems[10] = 0;
      result_7.m_backend.data._M_elems[0xb] = 0;
      result_7.m_backend.data._M_elems[0xc] = 0;
      result_7.m_backend.data._M_elems[0xd] = 0;
      result_7.m_backend.data._M_elems._56_5_ = 0;
      result_7.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_7.m_backend.exp = 0;
      result_7.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_7.m_backend,&u->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_6c0,this);
      bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1028,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_7.m_backend,&local_6c0);
      if (bVar6) {
LAB_0034e4f9:
        bVar6 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar13,&this->m_upJ);
        VVar7 = (uint)bVar6 * 2;
        pcVar13 = &(this->m_upJ).m_backend;
      }
      else {
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_10c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_10c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_10c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_10c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_10c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_10c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_10c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_10c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_10c8.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_10c8.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_10c8.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_10c8.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 0x10;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems[6] = 0;
        result_9.m_backend.data._M_elems[7] = 0;
        result_9.m_backend.data._M_elems[8] = 0;
        result_9.m_backend.data._M_elems[9] = 0;
        result_9.m_backend.data._M_elems[10] = 0;
        result_9.m_backend.data._M_elems[0xb] = 0;
        result_9.m_backend.data._M_elems[0xc] = 0;
        result_9.m_backend.data._M_elems[0xd] = 0;
        result_9.m_backend.data._M_elems._56_5_ = 0;
        result_9.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_9.m_backend.exp = 0;
        result_9.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_9.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_710,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_10c8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_9.m_backend,&local_710);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (pnVar1,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&result_4.m_backend);
          if (tVar5) goto LAB_0034e4f9;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1168.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_1168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_1168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_1168.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_1168.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_1168.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_1168.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_1168.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_1168.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_1168.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_1168.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar13);
        result_11.m_backend.fpclass = cpp_dec_float_finite;
        result_11.m_backend.prec_elem = 0x10;
        result_11.m_backend.data._M_elems[0] = 0;
        result_11.m_backend.data._M_elems[1] = 0;
        result_11.m_backend.data._M_elems[2] = 0;
        result_11.m_backend.data._M_elems[3] = 0;
        result_11.m_backend.data._M_elems[4] = 0;
        result_11.m_backend.data._M_elems[5] = 0;
        result_11.m_backend.data._M_elems[6] = 0;
        result_11.m_backend.data._M_elems[7] = 0;
        result_11.m_backend.data._M_elems[8] = 0;
        result_11.m_backend.data._M_elems[9] = 0;
        result_11.m_backend.data._M_elems[10] = 0;
        result_11.m_backend.data._M_elems[0xb] = 0;
        result_11.m_backend.data._M_elems[0xc] = 0;
        result_11.m_backend.data._M_elems[0xd] = 0;
        result_11.m_backend.data._M_elems._56_5_ = 0;
        result_11.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_11.m_backend.exp = 0;
        result_11.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_11.m_backend,&u->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_760,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1168,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_11.m_backend,&local_760);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (u,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_4.m_backend);
          if (!tVar5) goto LAB_0034e6b5;
LAB_0034e62e:
          bVar6 = boost::multiprecision::operator==(pnVar4,u);
          iVar3 = this->m_k;
          cStatus->data[iVar3] = (uint)bVar6 * 2;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&(x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&u->m_backend);
          cStatus->data[this->m_j] = BASIC;
          pcVar13 = &z2.m_backend;
          pcVar11 = &scale2.m_backend;
LAB_0034e98b:
          result_4.m_backend.fpclass = cpp_dec_float_finite;
          result_4.m_backend.prec_elem = 0x10;
          result_4.m_backend.exp = 0;
          result_4.m_backend.neg = false;
          result_4.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_4.m_backend.data._M_elems._56_5_ = 0;
          result_4.m_backend.data._M_elems[0xc] = 0;
          result_4.m_backend.data._M_elems[0xd] = 0;
          result_4.m_backend.data._M_elems[10] = 0;
          result_4.m_backend.data._M_elems[0xb] = 0;
          result_4.m_backend.data._M_elems[8] = 0;
          result_4.m_backend.data._M_elems[9] = 0;
          result_4.m_backend.data._M_elems[6] = 0;
          result_4.m_backend.data._M_elems[7] = 0;
          result_4.m_backend.data._M_elems[4] = 0;
          result_4.m_backend.data._M_elems[5] = 0;
          result_4.m_backend.data._M_elems[2] = 0;
          result_4.m_backend.data._M_elems[3] = 0;
          result_4.m_backend.data._M_elems[0] = 0;
          result_4.m_backend.data._M_elems[1] = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_4.m_backend,pcVar13,pcVar11);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&result_4.m_backend,&u_00->m_backend);
          iVar3 = this->m_j;
          pnVar10 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = result_1.m_backend.data._M_elems._48_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(result_1.m_backend.data._M_elems[0xf]._1_3_,
                        result_1.m_backend.data._M_elems._56_5_);
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = result_1.m_backend.data._M_elems._32_8_;
          *(undefined8 *)(puVar2 + 2) = result_1.m_backend.data._M_elems._40_8_;
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = result_1.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = result_1.m_backend.data._M_elems._24_8_;
          *(undefined8 *)&pnVar10[iVar3].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2) =
               result_1.m_backend.data._M_elems._8_8_;
          pnVar10[iVar3].m_backend.exp = result_1.m_backend.exp;
          pnVar10[iVar3].m_backend.neg = result_1.m_backend.neg;
          pnVar10[iVar3].m_backend.fpclass = result_1.m_backend.fpclass;
          pnVar10[iVar3].m_backend.prec_elem = result_1.m_backend.prec_elem;
          goto switchD_0034cf56_default;
        }
LAB_0034e6b5:
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1208.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_1208.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_1208.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1208.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_1208.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_1208.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_1208.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_1208.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_1208.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_1208.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_1208.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_1208.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar13);
        result_13.m_backend.fpclass = cpp_dec_float_finite;
        result_13.m_backend.prec_elem = 0x10;
        result_13.m_backend.data._M_elems[0] = 0;
        result_13.m_backend.data._M_elems[1] = 0;
        result_13.m_backend.data._M_elems[2] = 0;
        result_13.m_backend.data._M_elems[3] = 0;
        result_13.m_backend.data._M_elems[4] = 0;
        result_13.m_backend.data._M_elems[5] = 0;
        result_13.m_backend.data._M_elems[6] = 0;
        result_13.m_backend.data._M_elems[7] = 0;
        result_13.m_backend.data._M_elems[8] = 0;
        result_13.m_backend.data._M_elems[9] = 0;
        result_13.m_backend.data._M_elems[10] = 0;
        result_13.m_backend.data._M_elems[0xb] = 0;
        result_13.m_backend.data._M_elems[0xc] = 0;
        result_13.m_backend.data._M_elems[0xd] = 0;
        result_13.m_backend.data._M_elems._56_5_ = 0;
        result_13.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_13.m_backend.exp = 0;
        result_13.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_13.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_7b0,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1208,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_13.m_backend,&local_7b0);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,-*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar13,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_4.m_backend);
          if (tVar5) goto LAB_0034eb2b;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_12a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_12a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_12a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_12a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_12a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_12a8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_12a8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_12a8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_12a8.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_12a8.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_12a8.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_12a8.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar13);
        result_15.m_backend.fpclass = cpp_dec_float_finite;
        result_15.m_backend.prec_elem = 0x10;
        result_15.m_backend.data._M_elems[0] = 0;
        result_15.m_backend.data._M_elems[1] = 0;
        result_15.m_backend.data._M_elems[2] = 0;
        result_15.m_backend.data._M_elems[3] = 0;
        result_15.m_backend.data._M_elems[4] = 0;
        result_15.m_backend.data._M_elems[5] = 0;
        result_15.m_backend.data._M_elems[6] = 0;
        result_15.m_backend.data._M_elems[7] = 0;
        result_15.m_backend.data._M_elems[8] = 0;
        result_15.m_backend.data._M_elems[9] = 0;
        result_15.m_backend.data._M_elems[10] = 0;
        result_15.m_backend.data._M_elems[0xb] = 0;
        result_15.m_backend.data._M_elems[0xc] = 0;
        result_15.m_backend.data._M_elems[0xd] = 0;
        result_15.m_backend.data._M_elems._56_5_ = 0;
        result_15.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_15.m_backend.exp = 0;
        result_15.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_15.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_800,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_12a8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_15.m_backend,&local_800);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,-*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator>
                            (pnVar4,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&result_4.m_backend);
          if (tVar5) goto LAB_0034e909;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1348.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_1348.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_1348.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1348.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_1348.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_1348.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_1348.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_1348.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_1348.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_1348.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_1348.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_1348.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,pcVar13);
        local_1398.fpclass = cpp_dec_float_finite;
        local_1398.prec_elem = 0x10;
        local_1398.data._M_elems[0] = 0;
        local_1398.data._M_elems[1] = 0;
        local_1398.data._M_elems[2] = 0;
        local_1398.data._M_elems[3] = 0;
        local_1398.data._M_elems[4] = 0;
        local_1398.data._M_elems[5] = 0;
        local_1398.data._M_elems[6] = 0;
        local_1398.data._M_elems[7] = 0;
        local_1398.data._M_elems[8] = 0;
        local_1398.data._M_elems[9] = 0;
        local_1398.data._M_elems[10] = 0;
        local_1398.data._M_elems[0xb] = 0;
        local_1398.data._M_elems[0xc] = 0;
        local_1398.data._M_elems[0xd] = 0;
        local_1398.data._M_elems._56_5_ = 0;
        local_1398.data._M_elems[0xf]._1_3_ = 0;
        local_1398.exp = 0;
        local_1398.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_1398,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_850,this);
        bVar6 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1348,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1398,&local_850);
        if (!bVar6) {
          pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&result_1,"XMAISM08 This should never happen.",(allocator *)&result_4
                    );
          SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&result_1);
          __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
LAB_0034eb2b:
        bVar6 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar13,&this->m_upJ);
        VVar7 = bVar6 + ON_LOWER;
      }
      iVar3 = this->m_j;
      cStatus->data[iVar3] = VVar7;
      pcVar11 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    }
    else {
      local_13e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar10->m_backend).data;
      local_13e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 2);
      local_13e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 4);
      local_13e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 6);
      local_13e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 8);
      local_13e8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 10);
      local_13e8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 0xc);
      local_13e8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((pnVar10->m_backend).data._M_elems + 0xe);
      local_13e8.m_backend.exp = (pnVar10->m_backend).exp;
      local_13e8.m_backend.neg = (pnVar10->m_backend).neg;
      local_13e8.m_backend.fpclass = (pnVar10->m_backend).fpclass;
      local_13e8.m_backend.prec_elem = (pnVar10->m_backend).prec_elem;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems._56_5_ = 0;
      result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_1.m_backend,&u_00->m_backend,pcVar13);
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 0x10;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems[6] = 0;
      result_17.m_backend.data._M_elems[7] = 0;
      result_17.m_backend.data._M_elems[8] = 0;
      result_17.m_backend.data._M_elems[9] = 0;
      result_17.m_backend.data._M_elems[10] = 0;
      result_17.m_backend.data._M_elems[0xb] = 0;
      result_17.m_backend.data._M_elems[0xc] = 0;
      result_17.m_backend.data._M_elems[0xd] = 0;
      result_17.m_backend.data._M_elems._56_5_ = 0;
      result_17.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_17.m_backend.exp = 0;
      result_17.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_17.m_backend,&u->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_8a0,this);
      bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_13e8,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_17.m_backend,&local_8a0);
      if (bVar6) goto LAB_0034eb2b;
      iVar3 = this->m_k;
      pnVar10 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1488.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
      local_1488.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
      local_1488.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_1488.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
      local_1488.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_1488.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
      local_1488.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_1488.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_1488.m_backend.exp = pnVar10[iVar3].m_backend.exp;
      local_1488.m_backend.neg = pnVar10[iVar3].m_backend.neg;
      local_1488.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
      local_1488.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems._56_5_ = 0;
      result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_1.m_backend,&u_00->m_backend,pcVar13);
      result_19.m_backend.fpclass = cpp_dec_float_finite;
      result_19.m_backend.prec_elem = 0x10;
      result_19.m_backend.data._M_elems[0] = 0;
      result_19.m_backend.data._M_elems[1] = 0;
      result_19.m_backend.data._M_elems[2] = 0;
      result_19.m_backend.data._M_elems[3] = 0;
      result_19.m_backend.data._M_elems[4] = 0;
      result_19.m_backend.data._M_elems[5] = 0;
      result_19.m_backend.data._M_elems[6] = 0;
      result_19.m_backend.data._M_elems[7] = 0;
      result_19.m_backend.data._M_elems[8] = 0;
      result_19.m_backend.data._M_elems[9] = 0;
      result_19.m_backend.data._M_elems[10] = 0;
      result_19.m_backend.data._M_elems[0xb] = 0;
      result_19.m_backend.data._M_elems[0xc] = 0;
      result_19.m_backend.data._M_elems[0xd] = 0;
      result_19.m_backend.data._M_elems._56_5_ = 0;
      result_19.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_19.m_backend.exp = 0;
      result_19.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_19.m_backend,&pnVar4->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_8f0,this);
      bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1488,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_19.m_backend,&local_8f0);
      if (!bVar6) {
LAB_0034e09e:
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1528.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_1528.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_1528.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1528.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_1528.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_1528.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_1528.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_1528.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_1528.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_1528.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_1528.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_1528.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        pnVar1 = &this->m_upJ;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_21.m_backend.fpclass = cpp_dec_float_finite;
        result_21.m_backend.prec_elem = 0x10;
        result_21.m_backend.data._M_elems[0] = 0;
        result_21.m_backend.data._M_elems[1] = 0;
        result_21.m_backend.data._M_elems[2] = 0;
        result_21.m_backend.data._M_elems[3] = 0;
        result_21.m_backend.data._M_elems[4] = 0;
        result_21.m_backend.data._M_elems[5] = 0;
        result_21.m_backend.data._M_elems[6] = 0;
        result_21.m_backend.data._M_elems[7] = 0;
        result_21.m_backend.data._M_elems[8] = 0;
        result_21.m_backend.data._M_elems[9] = 0;
        result_21.m_backend.data._M_elems[10] = 0;
        result_21.m_backend.data._M_elems[0xb] = 0;
        result_21.m_backend.data._M_elems[0xc] = 0;
        result_21.m_backend.data._M_elems[0xd] = 0;
        result_21.m_backend.data._M_elems._56_5_ = 0;
        result_21.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_21.m_backend.exp = 0;
        result_21.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_21.m_backend,&u->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_940,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1528,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_21.m_backend,&local_940);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (u,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_4.m_backend);
          if (tVar5) goto LAB_0034e62e;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_15c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_15c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_15c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_15c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_15c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_15c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_15c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_15c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_15c8.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_15c8.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_15c8.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_15c8.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_23.m_backend.fpclass = cpp_dec_float_finite;
        result_23.m_backend.prec_elem = 0x10;
        result_23.m_backend.data._M_elems[0] = 0;
        result_23.m_backend.data._M_elems[1] = 0;
        result_23.m_backend.data._M_elems[2] = 0;
        result_23.m_backend.data._M_elems[3] = 0;
        result_23.m_backend.data._M_elems[4] = 0;
        result_23.m_backend.data._M_elems[5] = 0;
        result_23.m_backend.data._M_elems[6] = 0;
        result_23.m_backend.data._M_elems[7] = 0;
        result_23.m_backend.data._M_elems[8] = 0;
        result_23.m_backend.data._M_elems[9] = 0;
        result_23.m_backend.data._M_elems[10] = 0;
        result_23.m_backend.data._M_elems[0xb] = 0;
        result_23.m_backend.data._M_elems[0xc] = 0;
        result_23.m_backend.data._M_elems[0xd] = 0;
        result_23.m_backend.data._M_elems._56_5_ = 0;
        result_23.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_23.m_backend.exp = 0;
        result_23.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_23.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_990,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_15c8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_23.m_backend,&local_990);
        if (bVar6) {
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar8,(type *)0x0);
          tVar5 = boost::multiprecision::operator<
                            (pnVar1,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&result_4.m_backend);
          if (tVar5) goto LAB_0034e4f9;
        }
        iVar3 = this->m_k;
        pnVar10 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1668.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
        local_1668.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
        local_1668.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1668.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
        local_1668.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_1668.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
        local_1668.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_1668.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_1668.m_backend.exp = pnVar10[iVar3].m_backend.exp;
        local_1668.m_backend.neg = pnVar10[iVar3].m_backend.neg;
        local_1668.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
        local_1668.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
        result_25.m_backend.fpclass = cpp_dec_float_finite;
        result_25.m_backend.prec_elem = 0x10;
        result_25.m_backend.data._M_elems[0] = 0;
        result_25.m_backend.data._M_elems[1] = 0;
        result_25.m_backend.data._M_elems[2] = 0;
        result_25.m_backend.data._M_elems[3] = 0;
        result_25.m_backend.data._M_elems[4] = 0;
        result_25.m_backend.data._M_elems[5] = 0;
        result_25.m_backend.data._M_elems[6] = 0;
        result_25.m_backend.data._M_elems[7] = 0;
        result_25.m_backend.data._M_elems[8] = 0;
        result_25.m_backend.data._M_elems[9] = 0;
        result_25.m_backend.data._M_elems[10] = 0;
        result_25.m_backend.data._M_elems[0xb] = 0;
        result_25.m_backend.data._M_elems[0xc] = 0;
        result_25.m_backend.data._M_elems[0xd] = 0;
        result_25.m_backend.data._M_elems._56_5_ = 0;
        result_25.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_25.m_backend.exp = 0;
        result_25.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_25.m_backend,&pnVar4->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_9e0,this);
        bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1668,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_25.m_backend,&local_9e0);
        if (!bVar6) {
LAB_0034e3fd:
          iVar3 = this->m_k;
          pnVar10 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1708.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[iVar3].m_backend.data;
          local_1708.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2);
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
          local_1708.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_1708.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
          local_1708.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
          local_1708.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
          local_1708.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
          local_1708.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
          local_1708.m_backend.exp = pnVar10[iVar3].m_backend.exp;
          local_1708.m_backend.neg = pnVar10[iVar3].m_backend.neg;
          local_1708.m_backend.fpclass = pnVar10[iVar3].m_backend.fpclass;
          local_1708.m_backend.prec_elem = pnVar10[iVar3].m_backend.prec_elem;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&u_00->m_backend,&pnVar1->m_backend);
          local_1758.fpclass = cpp_dec_float_finite;
          local_1758.prec_elem = 0x10;
          local_1758.data._M_elems[0] = 0;
          local_1758.data._M_elems[1] = 0;
          local_1758.data._M_elems[2] = 0;
          local_1758.data._M_elems[3] = 0;
          local_1758.data._M_elems[4] = 0;
          local_1758.data._M_elems[5] = 0;
          local_1758.data._M_elems[6] = 0;
          local_1758.data._M_elems[7] = 0;
          local_1758.data._M_elems[8] = 0;
          local_1758.data._M_elems[9] = 0;
          local_1758.data._M_elems[10] = 0;
          local_1758.data._M_elems[0xb] = 0;
          local_1758.data._M_elems[0xc] = 0;
          local_1758.data._M_elems[0xd] = 0;
          local_1758.data._M_elems._56_5_ = 0;
          local_1758.data._M_elems[0xf]._1_3_ = 0;
          local_1758.exp = 0;
          local_1758.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_1758,&pnVar4->m_backend,&result_1.m_backend);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_a30,this);
          bVar6 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1708,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1758,&local_a30);
          if (!bVar6) {
            pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&result_1,"XMAISM09 This should never happen.",
                       (allocator *)&result_4);
            SPxInternalCodeException::SPxInternalCodeException(pSVar9,(string *)&result_1);
            __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          goto LAB_0034e4f9;
        }
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&result_4.m_backend,-*pdVar8,(type *)0x0);
        tVar5 = boost::multiprecision::operator>
                          (pnVar4,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&result_4.m_backend);
        if (!tVar5) goto LAB_0034e3fd;
LAB_0034e909:
        bVar6 = boost::multiprecision::operator==(pnVar4,u);
        iVar3 = this->m_k;
        cStatus->data[iVar3] = bVar6 + ON_LOWER;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&pnVar4->m_backend);
        cStatus->data[this->m_j] = BASIC;
        pcVar13 = &z1.m_backend;
        pcVar11 = &scale1.m_backend;
        goto LAB_0034e98b;
      }
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&result_4.m_backend,-*pdVar8,(type *)0x0);
      tVar5 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar13,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_4.m_backend);
      if (!tVar5) goto LAB_0034e09e;
      bVar6 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar13,&this->m_upJ);
      iVar3 = this->m_j;
      cStatus->data[iVar3] = bVar6 + ON_LOWER;
      pcVar11 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(pcVar11,pcVar13);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems._56_5_ = 0;
    result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result_1.m_backend,&u_00->m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&result_1.m_backend);
  default:
    goto switchD_0034cf56_default;
  }
  cStatus->data[this->m_j] = VVar7;
switchD_0034cf56_default:
  scale1.m_backend.fpclass = cpp_dec_float_finite;
  scale1.m_backend.prec_elem = 0x10;
  scale1.m_backend.data._M_elems[0] = 0;
  scale1.m_backend.data._M_elems[1] = 0;
  scale1.m_backend.data._M_elems[2] = 0;
  scale1.m_backend.data._M_elems[3] = 0;
  scale1.m_backend.data._M_elems[4] = 0;
  scale1.m_backend.data._M_elems[5] = 0;
  scale1.m_backend.data._M_elems[6] = 0;
  scale1.m_backend.data._M_elems[7] = 0;
  scale1.m_backend.data._M_elems[8] = 0;
  scale1.m_backend.data._M_elems[9] = 0;
  scale1.m_backend.data._M_elems[10] = 0;
  scale1.m_backend.data._M_elems[0xb] = 0;
  scale1.m_backend.data._M_elems[0xc] = 0;
  scale1.m_backend.data._M_elems[0xd] = 0;
  scale1.m_backend.data._M_elems._56_5_ = 0;
  scale1.m_backend.data._M_elems[0xf]._1_3_ = 0;
  scale1.m_backend.exp = 0;
  scale1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&scale1.m_backend,&(this->m_scale).m_backend,
             &(r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend);
  iVar3 = this->m_j;
  pnVar10 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = scale1.m_backend.data._M_elems._48_8_;
  *(ulong *)(puVar2 + 2) =
       CONCAT35(scale1.m_backend.data._M_elems[0xf]._1_3_,scale1.m_backend.data._M_elems._56_5_);
  puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = scale1.m_backend.data._M_elems._32_8_;
  *(undefined8 *)(puVar2 + 2) = scale1.m_backend.data._M_elems._40_8_;
  puVar2 = pnVar10[iVar3].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = scale1.m_backend.data._M_elems._16_8_;
  *(undefined8 *)(puVar2 + 2) = scale1.m_backend.data._M_elems._24_8_;
  *(undefined8 *)&pnVar10[iVar3].m_backend.data = scale1.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar10[iVar3].m_backend.data._M_elems + 2) = scale1.m_backend.data._M_elems._8_8_
  ;
  pnVar10[iVar3].m_backend.exp = scale1.m_backend.exp;
  pnVar10[iVar3].m_backend.neg = scale1.m_backend.neg;
  pnVar10[iVar3].m_backend.fpclass = scale1.m_backend.fpclass;
  pnVar10[iVar3].m_backend.prec_elem = scale1.m_backend.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}